

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fFboApiTest.cpp
# Opt level: O2

void deqp::gles2::Functional::validTexCubeAttachmentsTest(TestContext *testCtx,Context *context)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  
  (*context->_vptr_Context[9])(context,0x8d40,1);
  (*context->_vptr_Context[6])(context,0x8513,2);
  for (lVar2 = 0; lVar2 != 3; lVar2 = lVar2 + 1) {
    uVar1 = validTex2DAttachmentsTest::attachmentPoints[lVar2];
    for (lVar3 = 0; lVar3 != 0x18; lVar3 = lVar3 + 4) {
      (*context->_vptr_Context[0x1e])
                (context,0x8d40,(ulong)uVar1,
                 (ulong)*(uint *)((long)validTexCubeAttachmentsTest::cubeTargets + lVar3),2,0);
      checkError(testCtx,context,0);
    }
  }
  return;
}

Assistant:

static void validTexCubeAttachmentsTest (tcu::TestContext& testCtx, sglr::Context& context)
{
	static const GLenum attachmentPoints[] =
	{
		GL_COLOR_ATTACHMENT0,
		GL_DEPTH_ATTACHMENT,
		GL_STENCIL_ATTACHMENT
	};
	static const GLenum cubeTargets[] =
	{
		GL_TEXTURE_CUBE_MAP_POSITIVE_X,
		GL_TEXTURE_CUBE_MAP_POSITIVE_Y,
		GL_TEXTURE_CUBE_MAP_POSITIVE_Z,
		GL_TEXTURE_CUBE_MAP_NEGATIVE_X,
		GL_TEXTURE_CUBE_MAP_NEGATIVE_Y,
		GL_TEXTURE_CUBE_MAP_NEGATIVE_Z
	};

	context.bindFramebuffer(GL_FRAMEBUFFER, 1);

	// TextureCube
	deUint32 texCube = 2;
	context.bindTexture(GL_TEXTURE_CUBE_MAP, texCube);
	for (int pointNdx = 0; pointNdx < DE_LENGTH_OF_ARRAY(attachmentPoints); pointNdx++)
	{
		for (int targetNdx = 0; targetNdx < DE_LENGTH_OF_ARRAY(cubeTargets); targetNdx++)
		{
			context.framebufferTexture2D(GL_FRAMEBUFFER, attachmentPoints[pointNdx], cubeTargets[targetNdx], texCube, 0);
			checkError(testCtx, context, GL_NO_ERROR);
		}
	}
}